

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

bool CheckIfExitIsGood(AActor *self,level_info_t *info)

{
  level_info_t *target;
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  TAngle<double> local_38;
  FName local_2c;
  cluster_info_t *local_28;
  cluster_info_t *cluster;
  level_info_t *info_local;
  AActor *self_local;
  
  if (self == (AActor *)0x0) {
    self_local._7_1_ = true;
  }
  else {
    cluster = (cluster_info_t *)info;
    info_local = (level_info_t *)self;
    uVar2 = FIntCVar::operator_cast_to_int(&dmflags2);
    if (((uVar2 & 0x20000) == 0) || (level.killed_monsters == level.total_monsters)) {
      iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
      if (((iVar3 == 0) && (bVar1 = FBoolCVar::operator_cast_to_bool(&alwaysapplydmflags), !bVar1))
         || (uVar2 = FIntCVar::operator_cast_to_int(&dmflags), target = info_local,
            (uVar2 & 0x400) == 0)) {
        if ((((*(int *)((long)&info_local[1].SkyPic2.Chars + 4) < 1) && ((multiplayer & 1U) == 0))
            && ((cluster != (cluster_info_t *)0x0 &&
                ((*(int *)&cluster[1].ExitText.Chars == level.cluster &&
                 (local_28 = FindClusterInfo(level.cluster), local_28 != (cluster_info_t *)0x0))))))
           && ((local_28->flags & 1U) != 0)) {
          self_local._7_1_ = false;
        }
        else {
          iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
          if ((iVar3 != 0) && (gameaction != ga_completed)) {
            pcVar4 = userinfo_t::GetName((userinfo_t *)(*(long *)&info_local[1].flags2 + 0x38));
            Printf("%s exited the level.\n",pcVar4);
          }
          self_local._7_1_ = true;
        }
      }
      else {
        FName::FName(&local_2c,NAME_Exit);
        TAngle<double>::TAngle(&local_38,0.0);
        P_DamageMobj((AActor *)target,(AActor *)target,(AActor *)target,1000000,&local_2c,0,
                     &local_38);
        self_local._7_1_ = false;
      }
    }
    else {
      self_local._7_1_ = false;
    }
  }
  return self_local._7_1_;
}

Assistant:

bool CheckIfExitIsGood (AActor *self, level_info_t *info)
{
	cluster_info_t *cluster;

	// The world can always exit itself.
	if (self == NULL)
		return true;

	// We must kill all monsters to exit the level.
	if ((dmflags2 & DF2_KILL_MONSTERS) && level.killed_monsters != level.total_monsters)
		return false;

	// Is this a deathmatch game and we're not allowed to exit?
	if ((deathmatch || alwaysapplydmflags) && (dmflags & DF_NO_EXIT))
	{
		P_DamageMobj (self, self, self, TELEFRAG_DAMAGE, NAME_Exit);
		return false;
	}
	// Is this a singleplayer game and the next map is part of the same hub and we're dead?
	if (self->health <= 0 &&
		!multiplayer &&
		info != NULL &&
		info->cluster == level.cluster &&
		(cluster = FindClusterInfo(level.cluster)) != NULL &&
		cluster->flags & CLUSTER_HUB)
	{
		return false;
	}
	if (deathmatch && gameaction != ga_completed)
	{
		Printf ("%s exited the level.\n", self->player->userinfo.GetName());
	}
	return true;
}